

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

int check_vless_link(char *vless,FileName *varray,char *to_file,int *highest_p)

{
  bool bVar1;
  __ino_t _Var2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  FileName *pFVar10;
  FileName *pFVar11;
  uint uVar12;
  bool bVar13;
  char ver [16];
  stat sbuf;
  char name [255];
  char dir [4096];
  char local_11d8 [16];
  stat local_11c8;
  char local_1138 [256];
  char local_1038 [4104];
  
  alarm(TIMEOUT_TIME);
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    iVar3 = stat(vless,&local_11c8);
    if (iVar3 != -1) {
      alarm(0);
      _Var2 = local_11c8.st_ino;
      if (iVar3 != 0) goto LAB_0011dd38;
      if (local_11c8.st_nlink == 1) goto LAB_0011dd63;
      iVar3 = unpack_filename(vless,local_1038,local_1138,local_11d8,1);
      if (iVar3 == 0) {
        return 0;
      }
      uVar7 = varray->version_no;
      if (uVar7 == 0xffffffff) goto LAB_0011dd63;
      pFVar10 = (FileName *)0x0;
      pFVar11 = (FileName *)0x0;
      uVar12 = 0;
      bVar13 = false;
      goto LAB_0011ddc4;
    }
  } while (*piVar4 == 4);
LAB_0011dd20:
  alarm(0);
LAB_0011dd38:
  *Lisp_errno = *piVar4;
  return 0;
LAB_0011ddc4:
  if (uVar12 < uVar7) {
    pFVar11 = varray;
    uVar12 = uVar7;
  }
  bVar1 = !bVar13;
  bVar13 = true;
  if (bVar1) {
    pcVar5 = local_1038;
    pcVar8 = local_1038;
    if (uVar7 == 0) {
      bVar13 = false;
    }
    else {
      for (; (pcVar9 = pcVar8, *pcVar8 == '/' || (pcVar9 = pcVar5, *pcVar8 != '\0'));
          pcVar8 = pcVar8 + 1) {
        pcVar5 = pcVar9;
      }
      if (pcVar8 + -1 == pcVar5) {
        if (pcVar5 == local_1038) {
          local_1138[0] = '/';
          local_1138[1] = '\0';
        }
        else {
          strcpy(local_1138,local_1038);
        }
      }
      else {
        strcpy(local_1138,local_1038);
        sVar6 = strlen(local_1138);
        (local_1138 + sVar6)[0] = '/';
        (local_1138 + sVar6)[1] = '\0';
      }
      strcat(local_1138,varray->name);
      alarm(TIMEOUT_TIME);
      while( true ) {
        *piVar4 = 0;
        iVar3 = stat(local_1138,&local_11c8);
        if (iVar3 != -1) break;
        if (*piVar4 != 4) goto LAB_0011dd20;
      }
      alarm(0);
      if (iVar3 != 0) goto LAB_0011dd38;
      bVar13 = local_11c8.st_ino == _Var2;
      if (bVar13) {
        pFVar10 = varray;
      }
    }
  }
  uVar7 = varray[1].version_no;
  varray = varray + 1;
  if (uVar7 == 0xffffffff) {
    if (pFVar10 == (FileName *)0x0) {
LAB_0011dd63:
      *to_file = '\0';
    }
    else {
      *highest_p = (uint)(pFVar10 == pFVar11);
      strcpy(to_file,local_1138);
    }
    return 1;
  }
  goto LAB_0011ddc4;
}

Assistant:

static int check_vless_link(char *vless, FileName *varray, char *to_file, int *highest_p)
{
  int rval, found;
  unsigned max_no;
  ino_t vless_ino;
  struct stat sbuf;
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  FileName *max_entry, *linked_entry;

  TIMEOUT(rval = stat(vless, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (0);
  }

  if (sbuf.st_nlink == 1) {
    /* There is no file to which vless is hard linked. */
    *to_file = '\0';
    return (1);
  }
  vless_ino = sbuf.st_ino;

  if (unpack_filename(vless, dir, name, ver, 1) == 0) return (0);

  max_no = 0;
  found = 0;
  max_entry = NULL;
  linked_entry = NULL;

  while (varray->version_no != LASTVERSIONARRAY) {
    if (varray->version_no > max_no) {
      max_no = varray->version_no;
      max_entry = varray;
    }
    if (!found && varray->version_no != 0) {
      ConcDirAndName(dir, varray->name, name);
      TIMEOUT(rval = stat(name, &sbuf));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (0);
      }
      if (sbuf.st_ino == vless_ino) {
        found = 1;
        linked_entry = varray;
      }
    }
    varray++;
  }

  if (linked_entry != NULL) {
    if (linked_entry == max_entry) {
      *highest_p = 1;
    } else {
      *highest_p = 0;
    }
    strcpy(to_file, name);
  } else {
    *to_file = '\0';
  }
  return (1);
}